

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlmodule.c
# Opt level: O3

int xmlModuleSymbol(xmlModulePtr module,char *name,void **symbol)

{
  int iVar1;
  void *pvVar2;
  long lVar3;
  
  iVar1 = -1;
  if (((name != (char *)0x0) && (module != (xmlModulePtr)0x0)) && (symbol != (void **)0x0)) {
    pvVar2 = (void *)dlsym(module->handle);
    *symbol = pvVar2;
    lVar3 = dlerror();
    iVar1 = -(uint)(lVar3 != 0);
  }
  return iVar1;
}

Assistant:

int
xmlModuleSymbol(xmlModulePtr module, const char *name, void **symbol)
{
    int rc = -1;

    if ((NULL == module) || (symbol == NULL) || (name == NULL))
        return rc;

    rc = xmlModulePlatformSymbol(module->handle, name, symbol);

    if (rc == -1)
        return rc;

    return rc;
}